

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsObjectGetOwnPropertyDescriptor
          (JsValueRef object,JsValueRef propertyId,JsValueRef *propertyDescriptor)

{
  anon_class_24_3_937bb2fa fn;
  JsErrorCode JVar1;
  JsValueRef **in_stack_ffffffffffffffc0;
  JsValueRef *local_20;
  JsValueRef *propertyDescriptor_local;
  JsValueRef propertyId_local;
  JsValueRef object_local;
  
  fn.propertyId = &local_20;
  fn.object = &propertyDescriptor_local;
  fn.propertyDescriptor = in_stack_ffffffffffffffc0;
  local_20 = propertyDescriptor;
  propertyDescriptor_local = (JsValueRef *)propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<false,JsObjectGetOwnPropertyDescriptor::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsObjectGetOwnPropertyDescriptor(_In_ JsValueRef object, _In_ JsValueRef propertyId, _Out_ JsValueRef *propertyDescriptor)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(propertyDescriptor);
        *propertyDescriptor = nullptr;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Assert(propertyRecord != nullptr);

        return JsGetOwnPropertyDescriptorCommon(scriptContext, object, propertyRecord, propertyDescriptor);
    });
}